

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O1

void __thiscall spvtools::opt::IRContext::BuildScalarEvolutionAnalysis(IRContext *this)

{
  byte *pbVar1;
  ScalarEvolutionAnalysis *__ptr_00;
  ScalarEvolutionAnalysis *this_00;
  pointer *__ptr;
  pointer __p;
  ScalarEvolutionAnalysis *local_18;
  
  this_00 = (ScalarEvolutionAnalysis *)operator_new(0xa8);
  ScalarEvolutionAnalysis::ScalarEvolutionAnalysis(this_00,this);
  local_18 = (ScalarEvolutionAnalysis *)0x0;
  __ptr_00 = (this->scalar_evolution_analysis_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::ScalarEvolutionAnalysis,_std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::ScalarEvolutionAnalysis_*,_std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>_>
             .super__Head_base<0UL,_spvtools::opt::ScalarEvolutionAnalysis_*,_false>._M_head_impl;
  (this->scalar_evolution_analysis_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::ScalarEvolutionAnalysis,_std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::ScalarEvolutionAnalysis_*,_std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>_>
  .super__Head_base<0UL,_spvtools::opt::ScalarEvolutionAnalysis_*,_false>._M_head_impl = this_00;
  if (__ptr_00 != (ScalarEvolutionAnalysis *)0x0) {
    std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>::operator()
              ((default_delete<spvtools::opt::ScalarEvolutionAnalysis> *)
               &this->scalar_evolution_analysis_,__ptr_00);
  }
  if (local_18 != (ScalarEvolutionAnalysis *)0x0) {
    std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>::operator()
              ((default_delete<spvtools::opt::ScalarEvolutionAnalysis> *)&local_18,local_18);
  }
  pbVar1 = (byte *)((long)&this->valid_analyses_ + 1);
  *pbVar1 = *pbVar1 | 1;
  return;
}

Assistant:

void BuildScalarEvolutionAnalysis() {
    scalar_evolution_analysis_ = MakeUnique<ScalarEvolutionAnalysis>(this);
    valid_analyses_ = valid_analyses_ | kAnalysisScalarEvolution;
  }